

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     add<true,unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_char> destination,read_t<unsigned_char> source,Context *context)

{
  uchar uVar1;
  uchar uVar2;
  bool bVar3;
  byte bVar4;
  uchar result;
  Context *context_local;
  read_t<unsigned_char> source_local;
  modify_t<unsigned_char> destination_local;
  
  uVar1 = *destination;
  uVar2 = Flags::carry_bit<unsigned_char>(&context->flags);
  uVar2 = uVar1 + source + uVar2;
  bVar3 = Numeric::carried_out<true,7,unsigned_char>(*destination,source,uVar2);
  Flags::set_from<(InstructionSet::x86::Flag)0>(&context->flags,(uint)bVar3);
  bVar3 = Numeric::carried_in<4,unsigned_char>(*destination,source,uVar2);
  Flags::set_from<(InstructionSet::x86::Flag)1>(&context->flags,(uint)bVar3);
  bVar4 = Numeric::overflow<true,unsigned_char>(*destination,source,uVar2);
  Flags::set_from<(InstructionSet::x86::Flag)3>(&context->flags,(uint)bVar4);
  Flags::
  set_from<unsigned_char,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,uVar2);
  *destination = uVar2;
  return;
}

Assistant:

void add(
	modify_t<IntT> destination,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		DEST ← DEST + SRC [+ CF];
	*/
	/*
		The OF, SF, ZF, AF, CF, and PF flags are set according to the result.
	*/
	const IntT result = destination + source + (with_carry ? context.flags.template carry_bit<IntT>() : 0);

	context.flags.template set_from<Flag::Carry>(
		Numeric::carried_out<true, Numeric::bit_size<IntT>() - 1>(destination, source, result));
	context.flags.template set_from<Flag::AuxiliaryCarry>(
		Numeric::carried_in<4>(destination, source, result));
	context.flags.template set_from<Flag::Overflow>(
		Numeric::overflow<true, IntT>(destination, source, result));

	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(result);

	destination = result;
}